

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.cpp
# Opt level: O0

bool duckdb::ZSTDStorage::StringAnalyze(AnalyzeState *state_p,Vector *input,idx_t count)

{
  bool bVar1;
  string_t *psVar2;
  idx_t iVar3;
  UnifiedVectorFormat *pUVar4;
  ulong in_RDX;
  UnifiedVectorFormat *in_RSI;
  idx_t in_RDI;
  Vector *unaff_retaddr;
  idx_t string_size;
  string_t *str;
  idx_t idx;
  idx_t i;
  string_t *data;
  UnifiedVectorFormat vdata;
  ZSTDAnalyzeState *state;
  UnifiedVectorFormat *in_stack_ffffffffffffff30;
  TemplatedValidityMask<unsigned_long> *in_stack_ffffffffffffff38;
  undefined7 in_stack_ffffffffffffff40;
  undefined1 in_stack_ffffffffffffff47;
  ulong local_88;
  UnifiedVectorFormat local_68;
  ZSTDAnalyzeState *local_20;
  ulong local_18;
  
  local_18 = in_RDX;
  local_20 = AnalyzeState::Cast<duckdb::ZSTDAnalyzeState>((AnalyzeState *)in_stack_ffffffffffffff30)
  ;
  UnifiedVectorFormat::UnifiedVectorFormat
            ((UnifiedVectorFormat *)CONCAT17(in_stack_ffffffffffffff47,in_stack_ffffffffffffff40));
  Vector::ToUnifiedFormat(unaff_retaddr,in_RDI,in_RSI);
  psVar2 = UnifiedVectorFormat::GetData<duckdb::string_t>(&local_68);
  for (local_88 = 0; local_88 < local_18; local_88 = local_88 + 1) {
    iVar3 = SelectionVector::get_index(local_68.sel,local_88);
    bVar1 = TemplatedValidityMask<unsigned_long>::RowIsValid
                      (in_stack_ffffffffffffff38,(idx_t)in_stack_ffffffffffffff30);
    if (bVar1) {
      in_stack_ffffffffffffff38 =
           (TemplatedValidityMask<unsigned_long> *)string_t::GetSize(psVar2 + iVar3);
      local_20->total_size = (long)&in_stack_ffffffffffffff38->validity_mask + local_20->total_size;
    }
  }
  local_20->values_in_vector = local_18 + local_20->values_in_vector;
  while (0x7ff < local_20->values_in_vector) {
    in_stack_ffffffffffffff30 =
         (UnifiedVectorFormat *)GetVectorMetadataSize((idx_t)in_stack_ffffffffffffff30);
    pUVar4 = (UnifiedVectorFormat *)GetWritableSpace((CompressionInfo *)0xa1e05a);
    if (pUVar4 < in_stack_ffffffffffffff30) {
      local_20->vectors_per_segment = local_20->vectors_in_segment;
      local_20->segment_count = local_20->segment_count + 1;
      local_20->vectors_in_segment = 0;
    }
    else {
      local_20->vectors_in_segment = local_20->vectors_in_segment + 1;
    }
    local_20->values_in_vector = local_20->values_in_vector - 0x800;
  }
  local_20->count = local_18 + local_20->count;
  UnifiedVectorFormat::~UnifiedVectorFormat(in_stack_ffffffffffffff30);
  return true;
}

Assistant:

bool ZSTDStorage::StringAnalyze(AnalyzeState &state_p, Vector &input, idx_t count) {
	auto &state = state_p.Cast<ZSTDAnalyzeState>();
	UnifiedVectorFormat vdata;
	input.ToUnifiedFormat(count, vdata);

	auto data = UnifiedVectorFormat::GetData<string_t>(vdata);
	for (idx_t i = 0; i < count; i++) {
		auto idx = vdata.sel->get_index(i);
		if (!vdata.validity.RowIsValid(idx)) {
			continue;
		}
		auto &str = data[idx];
		auto string_size = str.GetSize();
		state.total_size += string_size;
	}
	state.values_in_vector += count;
	while (state.values_in_vector >= ZSTD_VECTOR_SIZE) {
		if (GetVectorMetadataSize(state.vectors_in_segment + 1) > GetWritableSpace(state.info)) {
			state.vectors_per_segment = state.vectors_in_segment;
			state.segment_count++;
			state.vectors_in_segment = 0;
		} else {
			state.vectors_in_segment++;
		}
		state.values_in_vector -= ZSTD_VECTOR_SIZE;
	}
	state.count += count;
	return true;
}